

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  long lVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  cmAlphaNum *this;
  uint uVar6;
  ulong dindex;
  Directory d;
  char *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  string startPath;
  cmAlphaNum local_d0;
  string finishPath;
  cmAlphaNum local_80;
  string fname;
  
  lVar2 = std::__cxx11::string::find((char *)path,0x22958c);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
    return;
  }
  local_f8 = files;
  std::__cxx11::string::substr((ulong)&startPath,(ulong)path);
  std::__cxx11::string::substr((ulong)&finishPath,(ulong)path);
  cmsys::Directory::Directory(&d);
  SVar3 = cmsys::Directory::Load(&d,&startPath,(string *)0x0);
  if (SVar3.Kind_ == Success) {
    uVar6 = 0;
    while( true ) {
      uVar4 = cmsys::Directory::GetNumberOfFiles(&d);
      dindex = (ulong)uVar6;
      if (uVar4 <= dindex) break;
      pcVar5 = cmsys::Directory::GetFile(&d,dindex);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,pcVar5,(allocator<char> *)&fname);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_80,".");
      this = &local_80;
      if (bVar1) {
        pcVar5 = cmsys::Directory::GetFile(&d,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,pcVar5,(allocator<char> *)&local_100);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_d0,"..");
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar1) {
          local_80.View_._M_len = startPath._M_string_length;
          local_80.View_._M_str = startPath._M_dataplus._M_p;
          local_d0.View_._M_len = 1;
          local_d0.View_._M_str = local_d0.Digits_;
          local_d0.Digits_[0] = '/';
          local_100 = cmsys::Directory::GetFile(&d,dindex);
          cmStrCat<char_const*>(&fname,&local_80,&local_d0,&local_100);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&fname);
          this = (cmAlphaNum *)&fname;
          if (bVar1) {
            std::__cxx11::string::append((string *)&fname);
            GlobDirs(&fname,local_f8);
          }
          goto LAB_001124e4;
        }
      }
      else {
LAB_001124e4:
        std::__cxx11::string::~string((string *)this);
      }
      uVar6 = uVar6 + 1;
    }
  }
  cmsys::Directory::~Directory(&d);
  std::__cxx11::string::~string((string *)&finishPath);
  std::__cxx11::string::~string((string *)&startPath);
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = cmStrCat(startPath, '/', d.GetFile(i));
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}